

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O0

MMDB_entry_data_list_s * test_arrayX_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  MMDB_entry_data_list_s *idx2;
  MMDB_entry_data_list_s *idx1;
  MMDB_entry_data_list_s *idx0;
  MMDB_entry_data_list_s *arrayX;
  MMDB_entry_data_list_s *entry_data_list_local;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x7f,(pMVar1->entry_data).type,"==",0xb,
                "\'map{mapX}{arrayX}\' key\'s value is an array",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x83,(pMVar1->entry_data).data_size,"==",3,
                "\'map{mapX}{arrayX}\' key\'s value has 3 elements",0);
  pMVar1 = pMVar1->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x89,(pMVar1->entry_data).type,"==",6,"first array entry is a UINT32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x8a,(pMVar1->entry_data).field_1.int32,"==",7,"first array entry value is 7",0);
  pMVar1 = pMVar1->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x90,(pMVar1->entry_data).type,"==",6,"second array entry is a UINT32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x91,(pMVar1->entry_data).field_1.int32,"==",8,"second array entry value is 8",0);
  pMVar1 = pMVar1->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x97,(pMVar1->entry_data).type,"==",6,"third array entry is a UINT32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x98,(pMVar1->entry_data).field_1.int32,"==",9,"third array entry value is 9",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_arrayX_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *arrayX = entry_data_list = entry_data_list->next;
    cmp_ok(arrayX->entry_data.type,
           "==",
           MMDB_DATA_TYPE_ARRAY,
           "'map{mapX}{arrayX}' key's value is an array");
    cmp_ok(arrayX->entry_data.data_size,
           "==",
           3,
           "'map{mapX}{arrayX}' key's value has 3 elements");

    MMDB_entry_data_list_s *idx0 = entry_data_list = entry_data_list->next;
    cmp_ok(idx0->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "first array entry is a UINT32");
    cmp_ok(idx0->entry_data.uint32, "==", 7, "first array entry value is 7");

    MMDB_entry_data_list_s *idx1 = entry_data_list = entry_data_list->next;
    cmp_ok(idx1->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "second array entry is a UINT32");
    cmp_ok(idx1->entry_data.uint32, "==", 8, "second array entry value is 8");

    MMDB_entry_data_list_s *idx2 = entry_data_list = entry_data_list->next;
    cmp_ok(idx2->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "third array entry is a UINT32");
    cmp_ok(idx2->entry_data.uint32, "==", 9, "third array entry value is 9");

    return entry_data_list;
}